

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O0

void __thiscall Memory::RecyclerSweepManager::BackgroundSweep(RecyclerSweepManager *this)

{
  RecyclerSweepManager *this_local;
  
  BeginBackground(this,(bool)(this->forceForeground & 1));
  HeapInfoManager::SweepSmallNonFinalizable(&this->recycler->autoHeap,this);
  FinishSweep(this);
  EndBackground(this);
  return;
}

Assistant:

void
RecyclerSweepManager::BackgroundSweep()
{
    this->BeginBackground(forceForeground);

    // Finish the concurrent part of the first pass
    this->recycler->autoHeap.SweepSmallNonFinalizable(*this);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (!CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) || !this->recycler->AllowAllocationsDuringConcurrentSweep())
#endif
    {
        // Finish the rest of the sweep
        this->FinishSweep();

        this->EndBackground();
    }
}